

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_PNGFilter.cc
# Opt level: O2

void __thiscall Pl_PNGFilter::decodeRow(Pl_PNGFilter *this)

{
  Pipeline *pPVar1;
  
  if (this->prev_row != (uchar *)0x0) {
    switch(*this->cur_row) {
    case '\x01':
      decodeSub(this);
      break;
    case '\x02':
      decodeUp(this);
      break;
    case '\x03':
      decodeAverage(this);
      break;
    case '\x04':
      decodePaeth(this);
    }
  }
  pPVar1 = (this->super_Pipeline).next_;
  (*pPVar1->_vptr_Pipeline[2])(pPVar1,this->cur_row + 1,(ulong)this->bytes_per_row);
  return;
}

Assistant:

void
Pl_PNGFilter::decodeRow()
{
    int filter = this->cur_row[0];
    if (this->prev_row) {
        switch (filter) {
        case 0:
            break;
        case 1:
            this->decodeSub();
            break;
        case 2:
            this->decodeUp();
            break;
        case 3:
            this->decodeAverage();
            break;
        case 4:
            this->decodePaeth();
            break;
        default:
            // ignore
            break;
        }
    }

    next()->write(this->cur_row + 1, this->bytes_per_row);
}